

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O3

void ScaleAddRow_AVX2(uint8_t *src_ptr,uint16_t *dst_ptr,int src_width)

{
  undefined1 auVar1 [32];
  bool bVar2;
  undefined1 auVar3 [32];
  int iVar4;
  
  do {
    auVar1 = *(undefined1 (*) [32])src_ptr;
    src_ptr = (uint8_t *)((long)src_ptr + 0x20);
    auVar3 = vpermq_avx2(auVar1,0xd8);
    auVar1 = vpunpcklbw_avx2(auVar3,(undefined1  [32])0x0);
    auVar3 = vpunpckhbw_avx2(auVar3,(undefined1  [32])0x0);
    auVar1 = vpaddusw_avx2(auVar1,*(undefined1 (*) [32])dst_ptr);
    auVar3 = vpaddusw_avx2(auVar3,*(undefined1 (*) [32])((long)dst_ptr + 0x20));
    *(undefined1 (*) [32])dst_ptr = auVar1;
    *(undefined1 (*) [32])((long)dst_ptr + 0x20) = auVar3;
    dst_ptr = (uint16_t *)((long)dst_ptr + 0x40);
    iVar4 = src_width + -0x20;
    bVar2 = 0x1f < src_width;
    src_width = iVar4;
  } while (iVar4 != 0 && bVar2);
  return;
}

Assistant:

void ScaleAddRow_AVX2(const uint8_t* src_ptr,
                      uint16_t* dst_ptr,
                      int src_width) {
  asm volatile(

      "vpxor       %%ymm5,%%ymm5,%%ymm5          \n"

      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm3                   \n"
      "lea         0x20(%0),%0                   \n"  // src_ptr += 32
      "vpermq      $0xd8,%%ymm3,%%ymm3           \n"
      "vpunpcklbw  %%ymm5,%%ymm3,%%ymm2          \n"
      "vpunpckhbw  %%ymm5,%%ymm3,%%ymm3          \n"
      "vpaddusw    (%1),%%ymm2,%%ymm0            \n"
      "vpaddusw    0x20(%1),%%ymm3,%%ymm1        \n"
      "vmovdqu     %%ymm0,(%1)                   \n"
      "vmovdqu     %%ymm1,0x20(%1)               \n"
      "lea         0x40(%1),%1                   \n"
      "sub         $0x20,%2                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src_ptr),   // %0
        "+r"(dst_ptr),   // %1
        "+r"(src_width)  // %2
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm5");
}